

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

bool str_cmp(char *astr,char *bstr)

{
  bool bVar1;
  int local_28;
  int local_20;
  char *bstr_local;
  char *astr_local;
  
  if ((astr != (char *)0x0) && (bstr_local = bstr, astr_local = astr, bstr != (char *)0x0)) {
    while( true ) {
      bVar1 = true;
      if (*astr_local == '\0') {
        bVar1 = *bstr_local != '\0';
      }
      if (!bVar1) {
        return false;
      }
      if ((*astr_local < 'A') || ('Z' < *astr_local)) {
        local_20 = (int)*astr_local;
      }
      else {
        local_20 = *astr_local + 0x20;
      }
      if ((*bstr_local < 'A') || ('Z' < *bstr_local)) {
        local_28 = (int)*bstr_local;
      }
      else {
        local_28 = *bstr_local + 0x20;
      }
      if (local_20 != local_28) break;
      astr_local = astr_local + 1;
      bstr_local = bstr_local + 1;
    }
  }
  return true;
}

Assistant:

bool str_cmp(const char *astr, const char *bstr)
{
	if (astr == nullptr)
	{
		//	RS.Logger.Warn("Str_cmp: null astr, bstr: {} ({}:{} dev=pimp)",gLastFile, gLastLine, bstr);
		return true;
	}

	if (bstr == nullptr)
	{
		//	RS.Logger.Warn("Str_cmp: null bstr, astr: {}", astr);
		return true;
	}

	for (; *astr || *bstr; astr++, bstr++)
	{
		if (LOWER(*astr) != LOWER(*bstr))
			return true;
	}

	return false;
}